

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntheticData.cpp
# Opt level: O0

MatrixXd *
GeneratePointsOnSphereSurface
          (MatrixXd *__return_storage_ptr__,int samples,Vector3d *center,double radius,double noise)

{
  bool bVar1;
  CoeffReturnType pdVar2;
  size_type sVar3;
  ulong uVar4;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  double dVar5;
  double dVar6;
  result_type rVar7;
  ColXpr local_af0;
  uint local_ab8;
  undefined1 local_ab1;
  uint i_1;
  double local_aa8;
  double local_aa0;
  double local_a98;
  double zz;
  double yy;
  double xx;
  double z;
  double x;
  double phi;
  double r;
  double y;
  int k;
  int i;
  double increment;
  double offset;
  normal_distribution<double> normal;
  undefined1 local_a10 [8];
  mt19937_64 rng;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  temp;
  double noise_local;
  double radius_local;
  Vector3d *center_local;
  int samples_local;
  MatrixXd *out;
  
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&rng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_a10,0);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&offset,0.0,noise);
  increment = 2.0 / (double)samples;
  dVar5 = sqrt(5.0);
  _k = (3.0 - dVar5) * 3.141592653589793;
  y._0_4_ = 0;
  for (y._4_4_ = 0; y._4_4_ < samples; y._4_4_ = y._4_4_ + 1) {
    r = (double)y._4_4_ * increment + -1.0 + increment * 0.5;
    phi = sqrt(1.0 - r * r);
    x = (double)y._4_4_ * _k;
    dVar5 = cos(x);
    z = dVar5 * phi;
    dVar6 = sin(x);
    dVar5 = z;
    xx = dVar6 * phi;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)center,0);
    dVar6 = r;
    yy = dVar5 * radius + *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)center,1);
    dVar5 = xx;
    zz = dVar6 * radius + *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)center,2);
    local_a98 = dVar5 * radius + *pdVar2;
    bVar1 = std::isfinite(yy);
    if (((bVar1) && (bVar1 = std::isfinite(zz), bVar1)) &&
       (bVar1 = std::isfinite(local_a98), dVar5 = yy, bVar1)) {
      rVar7 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&offset,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_a10);
      dVar6 = zz;
      local_aa0 = dVar5 + rVar7;
      rVar7 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&offset,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_a10);
      dVar5 = local_a98;
      local_aa8 = dVar6 + rVar7;
      rVar7 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&offset,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_a10);
      _i_1 = dVar5 + rVar7;
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double,double,double>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&rng._M_p,&local_aa0,&local_aa8,(double *)&i_1);
    }
  }
  local_ab1 = 0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__);
  sVar3 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&rng._M_p);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,3,sVar3);
  for (local_ab8 = 0; uVar4 = (ulong)local_ab8,
      sVar3 = std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)&rng._M_p), uVar4 < sVar3; local_ab8 = local_ab8 + 1) {
    other = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&rng._M_p,(ulong)local_ab8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_af0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               (ulong)local_ab8);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_af0,other);
  }
  local_ab1 = 1;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&rng._M_p);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd
GeneratePointsOnSphereSurface(
	const int samples,
	const Eigen::Vector3d center,
	const double radius,
	const double noise)
{
	std::vector<Eigen::Vector3d> temp;

	std::mt19937_64 rng(0);
	std::normal_distribution<double> normal(0, noise);

	const auto offset = 2. / samples;
	const auto increment = M_PI * (3. - sqrt(5.));

	for (int i = 0, k = 0; i < samples; i++) {
		const auto y = ((i * offset) - 1) + (offset / 2);
		const auto r = sqrt(1 - y*y);
		const auto phi = i * increment;
		const auto x = cos(phi) * r;
		const auto z = sin(phi) * r;
		const auto xx = x * radius + center[0];
		const auto yy = y * radius + center[1];
		const auto zz = z * radius + center[2];
		if (std::isfinite(xx) && std::isfinite(yy) && std::isfinite(zz)) {
			temp.emplace_back(xx + normal(rng), yy + normal(rng), zz + normal(rng));
		}
	}

	Eigen::MatrixXd out;
	out.resize(3, temp.size());
	for (unsigned int i = 0; i < temp.size(); i++) {
		out.col(i) = temp[i];
	}

	return out;
}